

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vsencoding.h
# Opt level: O2

void vsencoding::__vseblocks_unpack10(uint32_t *out,uint32_t *in,uint32_t bs)

{
  undefined4 uVar1;
  ulong uVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  ulong uVar7;
  uint uVar8;
  bool bVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar17 [32];
  
  auVar18._8_8_ = 0x200000004;
  auVar18._0_8_ = 0x200000004;
  auVar19._8_8_ = 0x3fc000003f0;
  auVar19._0_8_ = 0x3fc000003f0;
  auVar14._8_8_ = 0x600000008;
  auVar14._0_8_ = 0x600000008;
  auVar15._8_8_ = 0x3c000000300;
  auVar15._0_8_ = 0x3c000000300;
  auVar5 = vpmovsxbd_avx2(ZEXT816(0xd0d0d0101010000));
  auVar6 = vpmovsxbd_avx2(ZEXT816(0x6101a040e18020c));
  auVar16._8_4_ = 0x3ff;
  auVar16._0_8_ = 0x3ff000003ff;
  auVar16._12_4_ = 0x3ff;
  auVar17._16_4_ = 0x3ff;
  auVar17._0_16_ = auVar16;
  auVar17._20_4_ = 0x3ff;
  auVar17._24_4_ = 0x3ff;
  auVar17._28_4_ = 0x3ff;
  auVar4 = vpmovsxbd_avx(ZEXT416(0x1e08121c));
  auVar20._8_8_ = 0xa00000014;
  auVar20._0_8_ = 0xa00000014;
  uVar8 = bs + 0x1f >> 5;
  auVar18 = vpshufd_avx(auVar18,0x50);
  auVar19 = vpshufd_avx(auVar19,0x50);
  while (bVar9 = uVar8 != 0, uVar8 = uVar8 - 1, bVar9) {
    uVar2 = *(ulong *)in;
    uVar3 = *(ulong *)((long)in + 0xc);
    uVar1 = *(undefined4 *)((long)in + 0x1c);
    *out = (uint)(uVar2 >> 0x16) & 0x3ff;
    uVar7 = *(ulong *)((long)in + 8);
    auVar11._8_8_ = 0;
    auVar11._0_8_ = uVar2;
    auVar11 = vpsllvd_avx2(auVar11,auVar14);
    auVar11 = vpand_avx(auVar11,auVar15);
    auVar27._0_8_ = auVar11._0_8_;
    auVar27._8_8_ = auVar27._0_8_;
    auVar27._16_8_ = auVar27._0_8_;
    auVar27._24_8_ = auVar27._0_8_;
    auVar12 = vpbroadcastd_avx512vl();
    auVar12 = vpermt2d_avx512vl(ZEXT832(uVar2),auVar5,auVar12);
    auVar13 = vpsrlvd_avx2(auVar12,auVar6);
    auVar12 = vpand_avx2(auVar13,auVar17);
    auVar13 = vpor_avx2(auVar13,auVar27);
    auVar12 = vpblendd_avx2(auVar12,auVar13,0x24);
    auVar13 = vpbroadcastd_avx512vl();
    *(undefined1 (*) [32])(out + 1) = auVar12;
    auVar21._8_8_ = 0;
    auVar21._0_8_ = uVar3;
    auVar21 = vpshufd_avx(auVar21,0x40);
    auVar10._0_4_ = (undefined4)uVar3;
    auVar10._4_4_ = auVar10._0_4_;
    auVar10._8_4_ = auVar10._0_4_;
    auVar10._12_4_ = auVar10._0_4_;
    auVar11 = vpinsrd_avx(auVar10,(int)uVar7,0);
    auVar21 = vpsrlvd_avx2(auVar21,auVar4);
    uVar2 = *(ulong *)((long)in + 0x14);
    auVar22._0_8_ = auVar11._0_8_;
    auVar22._8_8_ = auVar22._0_8_;
    auVar11 = vpsllvd_avx2(auVar22,auVar18);
    auVar10 = vpternlogd_avx512vl(auVar11,auVar21,auVar19,0xec);
    auVar11 = vpand_avx(auVar21,auVar16);
    auVar11 = vpblendd_avx2(auVar10,auVar11,6);
    *(undefined1 (*) [16])(out + 9) = auVar11;
    auVar11 = vpbroadcastd_avx512vl();
    auVar11 = vpsrlvd_avx2(auVar11,auVar20);
    auVar11 = vpand_avx(auVar11,auVar16);
    *(long *)(out + 0xd) = auVar11._0_8_;
    out[0xf] = (uint)(uVar3 >> 0x20) & 0x3ff;
    uVar3 = *(ulong *)((long)in + 0x20);
    in = (uint32_t *)((long)in + 0x28);
    auVar23._8_8_ = 0;
    auVar23._0_8_ = uVar2;
    auVar11 = vpsllvd_avx2(auVar23,auVar14);
    auVar12 = vpermt2d_avx512vl(ZEXT832(uVar2),auVar5,auVar13);
    out[0x10] = (uint)(uVar2 >> 0x16) & 0x3ff;
    auVar11 = vpand_avx(auVar11,auVar15);
    auVar28._0_8_ = auVar11._0_8_;
    auVar28._8_8_ = auVar28._0_8_;
    auVar28._16_8_ = auVar28._0_8_;
    auVar28._24_8_ = auVar28._0_8_;
    auVar13 = vpsrlvd_avx2(auVar12,auVar6);
    auVar12 = vpand_avx2(auVar13,auVar17);
    auVar13 = vpor_avx2(auVar13,auVar28);
    auVar12 = vpblendd_avx2(auVar12,auVar13,0x24);
    *(undefined1 (*) [32])(out + 0x11) = auVar12;
    auVar24._8_8_ = 0;
    auVar24._0_8_ = uVar3;
    auVar21 = vpshufd_avx(auVar24,0x40);
    auVar25._0_4_ = (undefined4)uVar3;
    auVar25._4_4_ = auVar25._0_4_;
    auVar25._8_4_ = auVar25._0_4_;
    auVar25._12_4_ = auVar25._0_4_;
    auVar11 = vpinsrd_avx(auVar25,uVar1,0);
    auVar21 = vpsrlvd_avx2(auVar21,auVar4);
    auVar26._0_8_ = auVar11._0_8_;
    auVar26._8_8_ = auVar26._0_8_;
    auVar11 = vpsllvd_avx2(auVar26,auVar18);
    auVar10 = vpternlogd_avx512vl(auVar11,auVar21,auVar19,0xec);
    auVar11 = vpand_avx(auVar21,auVar16);
    auVar11 = vpblendd_avx2(auVar10,auVar11,6);
    *(undefined1 (*) [16])(out + 0x19) = auVar11;
    auVar11 = vpbroadcastd_avx512vl();
    auVar11 = vpsrlvd_avx2(auVar11,auVar20);
    auVar11 = vpand_avx(auVar11,auVar16);
    *(long *)(out + 0x1d) = auVar11._0_8_;
    out[0x1f] = (uint)(uVar3 >> 0x20) & 0x3ff;
    out = out + 0x20;
  }
  return;
}

Assistant:

void __vseblocks_unpack10(uint32_t *__restrict__ out,
                          const uint32_t *__restrict__ in, uint32_t bs) {
  for (bs = (bs + 31U) / 32U; bs > 0; out += 32, in += 10, --bs) {
    out[0] = in[0] >> 22;
    out[1] = (in[0] >> 12) & 0x03ff;
    out[2] = (in[0] >> 2) & 0x03ff;
    out[3] = (in[0] << 8) & 0x03ff;
    out[3] |= in[1] >> 24;
    out[4] = (in[1] >> 14) & 0x03ff;
    out[5] = (in[1] >> 4) & 0x03ff;
    out[6] = (in[1] << 6) & 0x03ff;
    out[6] |= in[2] >> 26;
    out[7] = (in[2] >> 16) & 0x03ff;
    out[8] = (in[2] >> 6) & 0x03ff;
    out[9] = (in[2] << 4) & 0x03ff;
    out[9] |= in[3] >> 28;
    out[10] = (in[3] >> 18) & 0x03ff;
    out[11] = (in[3] >> 8) & 0x03ff;
    out[12] = (in[3] << 2) & 0x03ff;
    out[12] |= in[4] >> 30;
    out[13] = (in[4] >> 20) & 0x03ff;
    out[14] = (in[4] >> 10) & 0x03ff;
    out[15] = in[4] & 0x03ff;
    out[16] = in[5] >> 22;
    out[17] = (in[5] >> 12) & 0x03ff;
    out[18] = (in[5] >> 2) & 0x03ff;
    out[19] = (in[5] << 8) & 0x03ff;
    out[19] |= in[6] >> 24;
    out[20] = (in[6] >> 14) & 0x03ff;
    out[21] = (in[6] >> 4) & 0x03ff;
    out[22] = (in[6] << 6) & 0x03ff;
    out[22] |= in[7] >> 26;
    out[23] = (in[7] >> 16) & 0x03ff;
    out[24] = (in[7] >> 6) & 0x03ff;
    out[25] = (in[7] << 4) & 0x03ff;
    out[25] |= in[8] >> 28;
    out[26] = (in[8] >> 18) & 0x03ff;
    out[27] = (in[8] >> 8) & 0x03ff;
    out[28] = (in[8] << 2) & 0x03ff;
    out[28] |= in[9] >> 30;
    out[29] = (in[9] >> 20) & 0x03ff;
    out[30] = (in[9] >> 10) & 0x03ff;
    out[31] = in[9] & 0x03ff;
  }
}